

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O2

int ecx_getindex(ecx_portt *port)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&port->getindex_mutex);
  iVar2 = port->lastidx + 1;
  if (0xe < port->lastidx) {
    iVar2 = 0;
  }
  uVar3 = 0;
  while( true ) {
    if ((port->rxbufstat[iVar2] == 0) || (0xf < uVar3)) break;
    uVar3 = uVar3 + 1;
    bVar1 = 0xe < iVar2;
    iVar2 = iVar2 + 1;
    if (bVar1) {
      iVar2 = 0;
    }
  }
  port->rxbufstat[iVar2] = 1;
  if (port->redstate != 0) {
    port->redport->rxbufstat[iVar2] = 1;
  }
  port->lastidx = iVar2;
  pthread_mutex_unlock((pthread_mutex_t *)&port->getindex_mutex);
  return iVar2;
}

Assistant:

int ecx_getindex(ecx_portt *port)
{
   int idx;
   int cnt;
#ifdef RTNET
   rt_mutex_acquire(&port->getindex_mutex, TM_INFINITE);
#else
   pthread_mutex_lock( &(port->getindex_mutex) );
#endif //RTNET

   idx = port->lastidx + 1;
   /* index can't be larger than buffer array */
   if (idx >= EC_MAXBUF) 
   {
      idx = 0;
   }
   cnt = 0;
   /* try to find unused index */
   while ((port->rxbufstat[idx] != EC_BUF_EMPTY) && (cnt < EC_MAXBUF))
   {
      idx++;
      cnt++;
      if (idx >= EC_MAXBUF) 
      {
         idx = 0;
      }
   }
   port->rxbufstat[idx] = EC_BUF_ALLOC;
   if (port->redstate != ECT_RED_NONE)
      port->redport->rxbufstat[idx] = EC_BUF_ALLOC;
   port->lastidx = idx;
#ifdef RTNET
   rt_mutex_release(&port->getindex_mutex);
#else
   pthread_mutex_unlock( &(port->getindex_mutex) );
#endif
   return idx;
}